

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_readfile.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  timeval end;
  timeval begin;
  timeval local_30;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  readfile(argv[1]);
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  poVar1 = std::operator<<((ostream *)&std::cout,"read time used:");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(int)((float)(local_30.tv_sec - local_20.tv_sec) * 1000.0 +
                                  (float)(local_30.tv_usec - local_20.tv_usec) / 1000.0));
  poVar1 = std::operator<<(poVar1," ms");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  struct timeval begin, end;
  gettimeofday(&begin, NULL);
  readfile(argv[1]);
  gettimeofday(&end, NULL);
  std::cout<<"read time used:"<<int(get_elapse_time(&begin, &end))<<" ms"<<std::endl;
}